

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_4::readPixelsGLES2(Functions *gl,Surface *dst)

{
  GLsizei GVar1;
  GLsizei GVar2;
  glReadPixelsFunc p_Var3;
  PixelBufferAccess local_48;
  
  p_Var3 = gl->readPixels;
  GVar1 = dst->m_width;
  GVar2 = dst->m_height;
  tcu::Surface::getAccess(&local_48,dst);
  (*p_Var3)(0,0,GVar1,GVar2,0x1908,0x1401,local_48.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

static void readPixelsGLES2 (const glw::Functions& gl, tcu::Surface& dst)
{
	gl.readPixels(0, 0, dst.getWidth(), dst.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}